

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CBinopExpression *expression)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> uVar1;
  TOperationType TVar2;
  CExpression *pCVar3;
  pointer pCVar4;
  CBinopExpression *pCVar5;
  CEseqExpression *pCVar6;
  CStatement *pCVar7;
  CEseqExpression *rightEseq_00;
  long local_118;
  CEseqExpression *local_108;
  CEseqFloatVisitor local_e0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c0;
  undefined1 local_b2;
  undefined1 local_b1;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_88;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  CEseqFloatVisitor local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_50;
  long local_48;
  CEseqExpression *rightEseq;
  CEseqExpression *leftEseq;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> right;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> left;
  CBinopExpression *expression_local;
  CEseqFloatVisitor *this_local;
  
  left._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )expression;
  pCVar3 = CBinopExpression::getLeftOperand(expression);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&this->childExpression);
  pCVar3 = CBinopExpression::getRightOperand
                     ((CBinopExpression *)
                      left._M_t.
                      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &leftEseq,&this->childExpression);
  pCVar4 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get(&local_20);
  if (pCVar4 == (pointer)0x0) {
    local_108 = (CEseqExpression *)0x0;
  }
  else {
    local_108 = (CEseqExpression *)
                __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  rightEseq = local_108;
  pCVar4 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
  if (pCVar4 == (pointer)0x0) {
    local_118 = 0;
  }
  else {
    local_118 = __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  uVar1._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       left._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  local_48 = local_118;
  if ((rightEseq == (CEseqExpression *)0x0) && (local_118 == 0)) {
    pCVar5 = (CBinopExpression *)operator_new(0x20);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 1;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70.childExpressionList,&local_20);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70.childExpression,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
    TVar2 = CBinopExpression::getOperation
                      ((CBinopExpression *)
                       left._M_t.
                       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CBinopExpression::CBinopExpression
              (pCVar5,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_70.childExpressionList,&local_70.childExpression,TVar2);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_50,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,&local_50);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_50);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70.childExpression);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
                &local_70.childExpressionList);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  else if ((rightEseq == (CEseqExpression *)0x0) && (local_118 != 0)) {
    pCVar6 = (CEseqExpression *)
             std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
             get(&local_20);
    processRightEseqInCBinop
              (&local_70,(CBinopExpression *)this,
               (CExpression *)
               uVar1._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,pCVar6);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
                &local_70);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  else if ((rightEseq == (CEseqExpression *)0x0) || (local_118 != 0)) {
    if ((rightEseq == (CEseqExpression *)0x0) || (local_118 == 0)) {
      local_70.childStatement._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 0;
    }
    else {
      pCVar6 = (CEseqExpression *)operator_new(0x18);
      pCVar7 = CEseqExpression::getStatement(rightEseq);
      (*(pCVar7->super_IStatement).super_INode._vptr_INode[3])(&local_e0.childExpression);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_e0.childExpressionList,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_e0.childExpression);
      uVar1 = left;
      rightEseq_00 = (CEseqExpression *)CEseqExpression::getExpression(rightEseq);
      processRightEseqInCBinop
                (&local_e0,(CBinopExpression *)this,
                 (CExpression *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,rightEseq_00);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_e0.childStatement,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_e0);
      CEseqExpression::CEseqExpression
                (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_e0.childExpressionList,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_e0.childStatement);
      std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
      unique_ptr<std::default_delete<IRT::CExpression_const>,void>
                ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
                 &local_c0,(pointer)pCVar6);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      operator=(&this->childExpression,&local_c0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_c0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                   *)&local_e0.childStatement);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                   *)&local_e0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_e0.childExpressionList);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_e0.childExpression);
      local_70.childStatement._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
  else {
    pCVar6 = (CEseqExpression *)operator_new(0x18);
    local_b2 = 1;
    pCVar7 = CEseqExpression::getStatement(rightEseq);
    (*(pCVar7->super_IStatement).super_INode._vptr_INode[3])(&local_88);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_80,&local_88);
    pCVar5 = (CBinopExpression *)operator_new(0x20);
    local_b1 = 1;
    pCVar3 = CEseqExpression::getExpression(rightEseq);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_a8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_a0,&local_a8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_b0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &leftEseq);
    TVar2 = CBinopExpression::getOperation
                      ((CBinopExpression *)
                       left._M_t.
                       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
    CBinopExpression::CBinopExpression(pCVar5,&local_a0,&local_b0,TVar2);
    local_b1 = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_98,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_90,&local_98);
    CEseqExpression::CEseqExpression(pCVar6,&local_80,&local_90);
    local_b2 = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_78,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_90);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_98);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_b0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_a0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_a8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_80);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_88);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &leftEseq);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CBinopExpression &expression) {
    expression.getLeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    expression.getRightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = dynamic_cast<const CEseqExpression*>(left.get());
    const CEseqExpression* rightEseq = dynamic_cast<const CEseqExpression*>(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CBinopExpression(
                std::move(left),
                std::move(right),
                expression.getOperation()
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childExpression = std::move(processRightEseqInCBinop(&expression, left.get(), rightEseq));

        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        expression.getOperation()
                ))
        ));


        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCBinop(&expression, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}